

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalSetFilePointer
                    (CPalThread *pThread,HANDLE hFile,LONG lDistanceToMove,
                    PLONG lpDistanceToMoveHigh,DWORD dwMoveMethod,PLONG lpNewFilePointerLow)

{
  undefined8 *local_58;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  PLONG pLStack_38;
  PAL_ERROR palError;
  PLONG lpNewFilePointerLow_local;
  PLONG pLStack_28;
  DWORD dwMoveMethod_local;
  PLONG lpDistanceToMoveHigh_local;
  HANDLE pVStack_18;
  LONG lDistanceToMove_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  local_58 = (undefined8 *)0x0;
  pLStack_38 = lpNewFilePointerLow;
  lpNewFilePointerLow_local._4_4_ = dwMoveMethod;
  pLStack_28 = lpDistanceToMoveHigh;
  lpDistanceToMoveHigh_local._4_4_ = lDistanceToMove;
  pVStack_18 = hFile;
  hFile_local = pThread;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalData);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,hFile_local,0,&local_58,&pLocalDataLock), pFileObject._4_4_ == 0)
       ) {
      pFileObject._4_4_ =
           InternalSetFilePointerForUnixFd
                     (*(int *)&pLocalDataLock[1]._vptr_IDataLock,lpDistanceToMoveHigh_local._4_4_,
                      pLStack_28,lpNewFilePointerLow_local._4_4_,pLStack_38);
    }
  }
  if (local_58 != (undefined8 *)0x0) {
    (**(code **)*local_58)(local_58,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetFilePointer(
    CPalThread *pThread,
    HANDLE hFile,
    LONG lDistanceToMove,
    PLONG lpDistanceToMoveHigh,
    DWORD dwMoveMethod,
    PLONG lpNewFilePointerLow
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalSetFilePointerExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFilePointerExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFilePointerExit;
    }

    palError = InternalSetFilePointerForUnixFd(
        pLocalData->unix_fd,
        lDistanceToMove,
        lpDistanceToMoveHigh,
        dwMoveMethod,
        lpNewFilePointerLow
        );
    
InternalSetFilePointerExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}